

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_entropyCompressSeqStore
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,size_t srcSize,void *entropyWorkspace,size_t entropyWkspSize,
                 int bmi2)

{
  ZSTD_fseCTables_t *nextEntropy_00;
  ZSTD_strategy ZVar1;
  seqDef *sequences;
  seqDef *psVar2;
  BYTE *src;
  BYTE *ofCodeTable;
  BYTE *llCodeTable;
  BYTE *mlCodeTable;
  int disableLiteralCompression;
  size_t err_code;
  byte *pbVar3;
  byte bVar4;
  uint suspectUncompressible;
  ulong nbSeq;
  ulong uVar5;
  ZSTD_symbolEncodingTypeStats_t stats;
  
  sequences = seqStorePtr->sequencesStart;
  psVar2 = seqStorePtr->sequences;
  nbSeq = (long)psVar2 - (long)sequences >> 3;
  src = seqStorePtr->litStart;
  uVar5 = (long)seqStorePtr->lit - (long)src;
  ZVar1 = (cctxParams->cParams).strategy;
  ofCodeTable = seqStorePtr->ofCode;
  llCodeTable = seqStorePtr->llCode;
  mlCodeTable = seqStorePtr->mlCode;
  if (psVar2 == sequences) {
    suspectUncompressible = 1;
  }
  else {
    suspectUncompressible = (uint)(0x13 < uVar5 / nbSeq);
  }
  disableLiteralCompression = ZSTD_literalsCompressionIsDisabled(cctxParams);
  uVar5 = ZSTD_compressLiterals
                    (dst,dstCapacity,src,uVar5,(void *)((long)entropyWorkspace + 0xd4),0x2204,
                     &prevEntropy->huf,&nextEntropy->huf,ZVar1,disableLiteralCompression,
                     suspectUncompressible,(int)entropyWkspSize);
  if (uVar5 < 0xffffffffffffff89) {
    if ((long)(dstCapacity - uVar5) < 4) {
      uVar5 = 0xffffffffffffffba;
    }
    else {
      pbVar3 = (byte *)(uVar5 + (long)dst);
      if (nbSeq < 0x80) {
        *pbVar3 = (byte)nbSeq;
        pbVar3 = pbVar3 + 1;
      }
      else if (nbSeq < 0x7f00) {
        *pbVar3 = (byte)(nbSeq >> 8) | 0x80;
        pbVar3[1] = (byte)nbSeq;
        pbVar3 = pbVar3 + 2;
      }
      else {
        *pbVar3 = 0xff;
        *(short *)(pbVar3 + 1) = (short)nbSeq + -0x7f00;
        pbVar3 = pbVar3 + 3;
      }
      nextEntropy_00 = &nextEntropy->fse;
      if (psVar2 == sequences) {
        switchD_00916250::default(nextEntropy_00,&prevEntropy->fse,0xde0);
      }
      else {
        ZSTD_buildSequencesStatistics
                  (&stats,seqStorePtr,nbSeq,&prevEntropy->fse,nextEntropy_00,pbVar3 + 1,
                   (BYTE *)((long)dst + dstCapacity),ZVar1,(uint *)entropyWorkspace,
                   (void *)((long)entropyWorkspace + 0xd4),0x2204);
        uVar5 = stats.size;
        if (0xffffffffffffff88 < stats.size) goto LAB_00f3abaf;
        *pbVar3 = (char)(stats.Offtype << 4) + (char)(stats.LLtype << 6) +
                  (char)stats.MLtype * '\x04';
        pbVar3 = pbVar3 + 1 + stats.size;
        uVar5 = ZSTD_encodeSequences
                          (pbVar3,(long)((long)dst + dstCapacity) - (long)pbVar3,
                           (nextEntropy->fse).matchlengthCTable,mlCodeTable,
                           nextEntropy_00->offcodeCTable,ofCodeTable,
                           (nextEntropy->fse).litlengthCTable,llCodeTable,sequences,nbSeq,
                           stats.longOffsets,(int)entropyWkspSize);
        if (0xffffffffffffff88 < uVar5) goto LAB_00f3abaf;
        if ((stats.lastCountSize != 0) && (stats.lastCountSize + uVar5 < 4)) {
          return 0;
        }
        pbVar3 = pbVar3 + uVar5;
      }
      uVar5 = (long)pbVar3 - (long)dst;
      if ((long)pbVar3 - (long)dst == 0) {
        return 0;
      }
    }
  }
LAB_00f3abaf:
  if ((srcSize <= dstCapacity) && (uVar5 == 0xffffffffffffffba)) {
    return 0;
  }
  if (0xffffffffffffff88 < uVar5) {
    return uVar5;
  }
  ZVar1 = (cctxParams->cParams).strategy;
  bVar4 = 6;
  if (7 < (int)ZVar1) {
    bVar4 = (char)ZVar1 - 1;
  }
  if ((srcSize - (srcSize >> (bVar4 & 0x3f))) - 2 <= uVar5) {
    return 0;
  }
  return uVar5;
}

Assistant:

MEM_STATIC size_t
ZSTD_entropyCompressSeqStore(
                    const seqStore_t* seqStorePtr,
                    const ZSTD_entropyCTables_t* prevEntropy,
                          ZSTD_entropyCTables_t* nextEntropy,
                    const ZSTD_CCtx_params* cctxParams,
                          void* dst, size_t dstCapacity,
                          size_t srcSize,
                          void* entropyWorkspace, size_t entropyWkspSize,
                          int bmi2)
{
    size_t const cSize = ZSTD_entropyCompressSeqStore_internal(
                            seqStorePtr, prevEntropy, nextEntropy, cctxParams,
                            dst, dstCapacity,
                            entropyWorkspace, entropyWkspSize, bmi2);
    if (cSize == 0) return 0;
    /* When srcSize <= dstCapacity, there is enough space to write a raw uncompressed block.
     * Since we ran out of space, block must be not compressible, so fall back to raw uncompressed block.
     */
    if ((cSize == ERROR(dstSize_tooSmall)) & (srcSize <= dstCapacity)) {
        DEBUGLOG(4, "not enough dstCapacity (%zu) for ZSTD_entropyCompressSeqStore_internal()=> do not compress block", dstCapacity);
        return 0;  /* block not compressed */
    }
    FORWARD_IF_ERROR(cSize, "ZSTD_entropyCompressSeqStore_internal failed");

    /* Check compressibility */
    {   size_t const maxCSize = srcSize - ZSTD_minGain(srcSize, cctxParams->cParams.strategy);
        if (cSize >= maxCSize) return 0;  /* block not compressed */
    }
    DEBUGLOG(5, "ZSTD_entropyCompressSeqStore() cSize: %zu", cSize);
    /* libzstd decoder before  > v1.5.4 is not compatible with compressed blocks of size ZSTD_BLOCKSIZE_MAX exactly.
     * This restriction is indirectly already fulfilled by respecting ZSTD_minGain() condition above.
     */
    assert(cSize < ZSTD_BLOCKSIZE_MAX);
    return cSize;
}